

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utlru_cache.hpp
# Opt level: O3

void __thiscall
cappuccino::
utlru_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>
::do_prune(utlru_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>
           *this,time_point now)

{
  size_t *psVar1;
  _List_node_base *p_Var2;
  pointer peVar3;
  _List_node_base *p_Var4;
  _List_node_base *p_Var5;
  _List_node_base *p_Var6;
  uint unaff_EBX;
  __off64_t *in_R8;
  size_t in_R9;
  
  if (this->m_used_size == 0) {
    return;
  }
  p_Var2 = (this->m_ttl_list).super__List_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl._M_node.super__List_node_base._M_next[1]._M_next;
  if ((long)now.__d.__r <
      (this->m_elements).
      super__Vector_base<cappuccino::utlru_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::element,_std::allocator<cappuccino::utlru_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::element>_>
      ._M_impl.super__Vector_impl_data._M_start[(long)p_Var2].m_expire_time.__d.__r) {
    do_erase(this,(size_t)(this->m_lru_list).
                          super__List_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          _M_node.super__List_node_base._M_prev[1]._M_next);
    return;
  }
  peVar3 = (this->m_elements).
           super__Vector_base<cappuccino::utlru_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::element,_std::allocator<cappuccino::utlru_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::element>_>
           ._M_impl.super__Vector_impl_data._M_start;
  p_Var4 = (this->m_lru_end)._M_node;
  p_Var6 = p_Var4->_M_prev;
  p_Var5 = peVar3[(long)p_Var2].m_lru_position._M_node;
  if (p_Var5 != p_Var6) {
    std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::splice
              (&this->m_lru_list,(int)p_Var4,(__off64_t *)&this->m_lru_list,(int)p_Var5,in_R8,in_R9,
               unaff_EBX);
    p_Var6 = ((this->m_lru_end)._M_node)->_M_prev;
  }
  (this->m_lru_end)._M_node = p_Var6;
  p_Var4 = peVar3[(long)p_Var2].m_ttl_position._M_node;
  psVar1 = &(this->m_ttl_list).super__List_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl._M_node._M_size;
  *psVar1 = *psVar1 - 1;
  std::__detail::_List_node_base::_M_unhook();
  operator_delete(p_Var4,0x18);
  std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::erase(&(this->m_keyed_elements)._M_h,
          (const_iterator)
          peVar3[(long)p_Var2].m_keyed_position.
          super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>._M_cur);
  this->m_used_size = this->m_used_size - 1;
  return;
}

Assistant:

auto do_prune(std::chrono::steady_clock::time_point now) -> void
    {
        if (m_used_size > 0)
        {
            size_t   ttl_idx = *m_ttl_list.begin();
            element& e       = m_elements[ttl_idx];

            if (now >= e.m_expire_time)
            {
                do_erase(ttl_idx);
            }
            else
            {
                size_t lru_idx = m_lru_list.back();
                do_erase(lru_idx);
            }
        }
    }